

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::anon_unknown_2::ScanCanvasTest::~ScanCanvasTest(ScanCanvasTest *this)

{
  ScanCanvasTest *this_local;
  
  ~ScanCanvasTest(this);
  operator_delete(this);
  return;
}

Assistant:

int run() override {
		if (chipset.card_type < 3) {
			nva_wr32(cnum, 0x4006a4, 0x0f000111);
		}
		for (auto &reg : pgraph_canvas_regs(chipset)) {
			if (reg->scan_test(cnum, rnd))
				res = HWTEST_RES_FAIL;
		}
		return res;
	}